

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall
icu_63::RangeDescriptor::split(RangeDescriptor *this,UChar32 where,UErrorCode *status)

{
  UBool UVar1;
  RangeDescriptor *this_00;
  undefined4 in_register_00000034;
  RangeDescriptor *p;
  RangeDescriptor *local_48;
  RangeDescriptor *nr;
  UErrorCode *status_local;
  UChar32 where_local;
  RangeDescriptor *this_local;
  
  p = (RangeDescriptor *)CONCAT44(in_register_00000034,where);
  this_00 = (RangeDescriptor *)UMemory::operator_new((UMemory *)0x20,(size_t)p);
  local_48 = (RangeDescriptor *)0x0;
  if (this_00 != (RangeDescriptor *)0x0) {
    p = this;
    RangeDescriptor(this_00,this,status);
    local_48 = this_00;
  }
  if (local_48 == (RangeDescriptor *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      local_48->fStartChar = where;
      this->fEndChar = where + -1;
      local_48->fNext = this->fNext;
      this->fNext = local_48;
    }
    else if (local_48 != (RangeDescriptor *)0x0) {
      ~RangeDescriptor(local_48);
      UMemory::operator_delete((UMemory *)local_48,p);
    }
  }
  return;
}

Assistant:

void RangeDescriptor::split(UChar32 where, UErrorCode &status) {
    U_ASSERT(where>fStartChar && where<=fEndChar);
    RangeDescriptor *nr = new RangeDescriptor(*this, status);
    if(nr == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    if (U_FAILURE(status)) {
        delete nr;
        return;
    }
    //  RangeDescriptor copy constructor copies all fields.
    //  Only need to update those that are different after the split.
    nr->fStartChar = where;
    this->fEndChar = where-1;
    nr->fNext      = this->fNext;
    this->fNext    = nr;
}